

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O0

void nn_print_option(nn_parse_context *ctx,int opt_index,FILE *stream)

{
  char *__s;
  nn_option *pnVar1;
  char *pcVar2;
  size_t sVar3;
  nn_option *opt;
  size_t olen;
  char *oend;
  char *ousage;
  FILE *stream_local;
  int opt_index_local;
  nn_parse_context *ctx_local;
  
  pnVar1 = ctx->options + opt_index;
  __s = ctx->last_option_usage[opt_index];
  if (*__s == '-') {
    pcVar2 = strchr(__s,0x3d);
    if (pcVar2 == (char *)0x0) {
      opt = (nn_option *)strlen(__s);
    }
    else {
      opt = (nn_option *)(pcVar2 + -(long)__s);
    }
    sVar3 = strlen(pnVar1->longname);
    if (opt == (nn_option *)(sVar3 + 2)) {
      fprintf((FILE *)stream," %s ",__s);
    }
    else {
      fprintf((FILE *)stream," %.*s[%s] ",(ulong)opt & 0xffffffff,__s,
              pnVar1->longname + -2 + (long)&opt->longname);
    }
  }
  else if (__s == *ctx->argv) {
    fprintf((FILE *)stream," %s (executable) ",__s);
  }
  else {
    fprintf((FILE *)stream," -%c (--%s) ",(ulong)(uint)(int)*__s,pnVar1->longname);
  }
  return;
}

Assistant:

static void nn_print_option (struct nn_parse_context *ctx, int opt_index,
                            FILE *stream)
{
    char *ousage;
    char *oend;
    size_t olen;
    struct nn_option *opt;

    opt = &ctx->options[opt_index];
    ousage = ctx->last_option_usage[opt_index];
    if (*ousage == '-') {  /* Long option */
        oend = strchr (ousage, '=');
        if (!oend) {
            olen = strlen (ousage);
        } else {
            olen = (oend - ousage);
        }
        if (olen != strlen (opt->longname)+2) {
            fprintf (stream, " %.*s[%s] ",
                (int)olen, ousage, opt->longname + (olen-2));
        } else {
            fprintf (stream, " %s ", ousage);
        }
    } else if (ousage == ctx->argv[0]) {  /* Binary name */
        fprintf (stream, " %s (executable) ", ousage);
    } else {  /* Short option */
        fprintf (stream, " -%c (--%s) ",
            *ousage, opt->longname);
    }
}